

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall
Network::copyCreditTransactions
          (Network *this,int index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transactionInfo,CreditCard *toAdd)

{
  int iVar1;
  CreditCard *this_00;
  reference pvVar2;
  CreditCard *copyToAdd;
  CreditCard *toAdd_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *transactionInfo_local;
  int index_local;
  Network *this_local;
  
  this_00 = (CreditCard *)operator_new(0x80);
  CreditCard::CreditCard(this_00,toAdd);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(transactionInfo,(long)(index + 1));
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  if (iVar1 == 1) {
    Peer::addTransaction(this->peer1,&toAdd->super_Transaction);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(transactionInfo,(long)(index + 1));
    iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
    if (iVar1 == 2) {
      Peer::addTransaction(this->peer2,&toAdd->super_Transaction);
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(transactionInfo,(long)(index + 1));
      iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
      if (iVar1 == 3) {
        Peer::addTransaction(this->peer3,&toAdd->super_Transaction);
      }
    }
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(transactionInfo,(long)(index + 2));
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  if (iVar1 == 1) {
    Peer::addTransaction(this->peer1,(Transaction *)this_00);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(transactionInfo,(long)(index + 2));
    iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
    if (iVar1 == 2) {
      Peer::addTransaction(this->peer2,(Transaction *)this_00);
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(transactionInfo,(long)(index + 2));
      iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
      if (iVar1 == 3) {
        Peer::addTransaction(this->peer3,(Transaction *)this_00);
      }
    }
  }
  return;
}

Assistant:

void Network::copyCreditTransactions(int index, vector<string> transactionInfo, CreditCard *toAdd)
{
    CreditCard *copyToAdd;
    copyToAdd = new CreditCard(*toAdd);
//finds which peer to add the transaction to
    if(stoi(transactionInfo.at(index + 1)) == 1)
    {
        peer1->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 2)
    {
        peer2->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 3)
    {
        peer3->addTransaction(toAdd);
    }
    //finds which peer to add the copy of the transaction to
    if(stoi(transactionInfo.at(index + 2)) == 1)
    {
        peer1->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 2)
    {
        peer2->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 3)
    {
        peer3->addTransaction(copyToAdd);
    }
}